

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall JetHead::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  uint __i;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  undefined4 in_register_0000000c;
  int iVar7;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  int ret;
  socklen_t local_bc;
  timeval t;
  fd_set fd_w;
  
  __addr_00 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  __len_00._0_2_ = __addr_00[1].sa_family;
  __len_00._2_1_ = __addr_00[1].sa_data[0];
  __len_00._3_1_ = __addr_00[1].sa_data[1];
  t.tv_sec = (__time_t)(int)__addr;
  t.tv_usec = 0;
  uVar1 = fcntl(this->mFd,3,0,CONCAT44(in_register_0000000c,__len));
  iVar7 = -1;
  if (-1 < (int)uVar1) {
    iVar2 = fcntl(this->mFd,4,(ulong)(uVar1 | 0x800));
    if (-1 < iVar2) {
      iVar3 = ::connect(this->mFd,__addr_00,__len_00);
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      iVar4 = fcntl(this->mFd,4,(ulong)uVar1);
      if ((-1 < iVar4) && ((-1 < iVar3 || (iVar2 == 0x73)))) {
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fd_w.fds_bits[lVar6] = 0;
        }
        fd_w.fds_bits[this->mFd / 0x40] =
             fd_w.fds_bits[this->mFd / 0x40] | 1L << ((byte)this->mFd & 0x3f);
        iVar2 = select(0x400,(fd_set *)0x0,(fd_set *)&fd_w,(fd_set *)0x0,(timeval *)&t);
        if (0 < iVar2) {
          local_bc = 4;
          iVar2 = getsockopt(this->mFd,1,4,&ret,&local_bc);
          if (((-1 < iVar2) && (ret == 0)) && (iVar7 = iVar2, iVar2 == 0)) {
            setConnected(this,true,1);
            iVar7 = 0;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int Socket::connect( const Socket::Address &addr, int timeout )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	socklen_t len = 0;
	int len_addr = 0;
	int res = 0;
	int saveflags, ret, back_err;
	const struct sockaddr *saddr = addr.getAddr( len_addr );
	fd_set fd_w;
	struct timeval t;

	t.tv_sec = timeout;
	t.tv_usec = 0;

	saveflags=fcntl(mFd,F_GETFL,0);

	if( saveflags < 0 ) {
		return -1;
	}

	/* Set non blocking */
	if(fcntl(mFd,F_SETFL,saveflags|O_NONBLOCK)<0) {
		return -1;
	}

	/* This will return immediately */
	res = ::connect( mFd, saddr, len_addr );
	back_err=errno;

	/* restore flags */
	if(fcntl(mFd,F_SETFL,saveflags)<0) {
		return -1;
	}

	/* return unless the connection was successful or the connect is
	still in progress. */
	if(res<0 && back_err!=EINPROGRESS) {
		return -1;
	}

	FD_ZERO(&fd_w);
	FD_SET(mFd,&fd_w);

	res=select(FD_SETSIZE,NULL,&fd_w,NULL,&t);

	if(res < 0) {
		return -1;
	}

	/* 0 means it timeout out & no fds changed */
	if( res == 0 ) {
		return -1;
	}

	/* Get the return code from the connect */
	len=sizeof(ret);
	res=getsockopt(mFd,SOL_SOCKET,SO_ERROR,&ret,&len);
	if(res<0) {
		return -1;
	}

	/* ret=0 means success, otherwise it contains the errno */
	if(ret) {
		return -1;
	}

	LOG_NOTICE( "connect to %s on port %d", addr.getName(), addr.getPort() );

	if ( res == 0 )
		setConnected( true );

	return res;
}